

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csr.c
# Opt level: O2

int csrMain(int argc,char **argv)

{
  char **ppcVar1;
  int iVar2;
  err_t code;
  bool_t bVar3;
  octet *poVar4;
  char *pcVar5;
  long lVar6;
  cmd_pwd_t pwd_00;
  long lVar7;
  octet *csr;
  int iVar8;
  long lVar9;
  cmd_pwd_t pwd;
  char **local_50;
  size_t local_48;
  size_t privkey_len;
  long local_38;
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  csr rewrap -pass <schema> <privkey> <csr> <csr1>\n    rewrap <csr> using <privkey> and store the result in <csr1>\n  csr val <csr>\n    validate <csr>\n  options:\n    -pass <schema> -- password description\n\\warning implemented only with bign-curve256v1\n"
           ,"csr","manage certificate signing requests");
    return -1;
  }
  iVar8 = -1;
  iVar2 = strCmp(argv[1],"rewrap");
  if (iVar2 == 0) {
    pwd = (cmd_pwd_t)0x0;
    privkey_len = 0;
    local_50 = argv;
    code = cmdStDo(8);
    if (code == 0) {
      local_38 = (ulong)(uint)argc - 2;
      lVar7 = -0x20;
      lVar6 = -0x10;
      lVar9 = 0;
      do {
        ppcVar1 = local_50;
        iVar8 = (int)lVar9;
        if (((int)local_38 == iVar8) || (bVar3 = strStartsWith(local_50[lVar9 + 2],"-"), bVar3 == 0)
           ) {
          ppcVar1 = local_50;
          code = 0x25b;
          pwd_00 = pwd;
          if ((argc + -5 == iVar8 && pwd != (cmd_pwd_t)0x0) &&
             (((code = cmdFileValExist(2,(char **)((long)local_50 - lVar6)), pwd_00 = pwd, code == 0
               && (code = cmdFileValNotExist(1,(char **)((long)ppcVar1 - lVar7)), pwd_00 = pwd,
                  code == 0)) &&
              (code = cmdPrivkeyRead((octet *)0x0,&privkey_len,ppcVar1[lVar9 + 2],pwd), pwd_00 = pwd
              , code == 0)))) {
            code = cmdFileReadAll((void *)0x0,&local_48,ppcVar1[lVar9 + 3]);
            if (code != 0) goto LAB_0010874f;
            poVar4 = (octet *)blobCreate(local_48 + privkey_len);
            if (poVar4 == (octet *)0x0) {
              cmdPwdClose(pwd);
              code = 0x6e;
              goto LAB_0010874f;
            }
            csr = poVar4 + privkey_len;
            code = cmdPrivkeyRead(poVar4,&privkey_len,local_50[lVar9 + 2],pwd);
            cmdPwdClose(pwd);
            if (code == 0) {
              code = cmdFileReadAll(csr,&local_48,local_50[lVar9 + 3]);
              if (code != 0) goto LAB_0010874f;
              code = bpkiCSRRewrap(csr,local_48,poVar4,privkey_len);
              if (code == 0) {
                code = cmdFileWrite(local_50[lVar9 + 4],csr,local_48);
              }
            }
            blobClose(poVar4);
            goto LAB_0010874f;
          }
          break;
        }
        iVar2 = strCmp(ppcVar1[lVar9 + 2],"-pass");
        code = 0x25b;
        pwd_00 = pwd;
        if (iVar2 != 0) break;
        if (pwd != (cmd_pwd_t)0x0) {
          code = 0x25c;
          break;
        }
        if (argc + -3 == iVar8) {
          pwd_00 = (cmd_pwd_t)0x0;
          break;
        }
        code = cmdPwdRead(&pwd,local_50[lVar9 + 3]);
        lVar9 = lVar9 + 2;
        lVar7 = lVar7 + -0x10;
        lVar6 = lVar6 + -0x10;
        pwd_00 = pwd;
      } while (code == 0);
      cmdPwdClose(pwd_00);
    }
  }
  else {
    iVar2 = strCmp(argv[1],"val");
    code = 0x259;
    if (iVar2 != 0) goto LAB_00108753;
    local_50 = argv;
    code = cmdStDo(8);
    if (code == 0) {
      ppcVar1 = local_50 + 2;
      code = cmdFileValExist(1,ppcVar1);
      if ((code == 0) && (code = cmdFileReadAll((void *)0x0,(size_t *)&pwd,*ppcVar1), code == 0)) {
        poVar4 = (octet *)blobCreate((size_t)pwd);
        if (poVar4 == (octet *)0x0) {
          code = 0x6e;
        }
        else {
          code = cmdFileReadAll(poVar4,(size_t *)&pwd,*ppcVar1);
          if (code == 0) {
            code = bpkiCSRUnwrap((octet *)0x0,(size_t *)0x0,poVar4,(size_t)pwd);
          }
          blobClose(poVar4);
        }
      }
    }
  }
LAB_0010874f:
  iVar8 = -1;
  if (code == 0) {
    iVar2 = strCmp(local_50[1],"val");
    iVar8 = 0;
    code = 0;
    if (iVar2 != 0) {
      return 0;
    }
  }
LAB_00108753:
  pcVar5 = errMsg(code);
  printf("bee2cmd/%s: %s\n","csr",pcVar5);
  return iVar8;
}

Assistant:

int csrMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return csrUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "rewrap"))
		code = csrRewrap(argc - 1, argv + 1);
	else if (strEq(argv[0], "val"))
		code = csrVal(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "val"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}